

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O0

ostream * binlog::operator<<(ostream *out,ClockSync *a)

{
  ostream *poVar1;
  ulong *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"ClockSync{");
  poVar1 = std::operator<<(poVar1,"clockValue: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,"clockFrequency: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1,"nsSinceEpoch: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
  poVar1 = std::operator<<(poVar1,"tzOffset: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)in_RSI[3]);
  poVar1 = std::operator<<(poVar1,"tzName: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 4));
  poVar1 = std::operator<<(poVar1," }");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ClockSync& a)
{
  return
  out << "ClockSync{"
      << "clockValue: " << a.clockValue
      << "clockFrequency: " << a.clockFrequency
      << "nsSinceEpoch: " << a.nsSinceEpoch
      << "tzOffset: " << a.tzOffset
      << "tzName: " << a.tzName << " }";
}